

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void read_config_file(string *config_path)

{
  istreambuf_iterator<char,_std::char_traits<char>_> __last;
  istreambuf_iterator<char,_std::char_traits<char>_> __first;
  xml_node<char> *name_size;
  xml_node<char> *xmlns_size;
  xml_node<char> *pxVar1;
  undefined8 in_RDI;
  xml_node<char> *node_1;
  xml_node<char> *node;
  string dir_path;
  xml_node<char> *root_node;
  xml_document<char> document;
  vector<char,_std::allocator<char>_> buffer;
  ifstream config_file;
  value_type_conflict4 *in_stack_fffffffffffefc28;
  xml_document<char> *in_stack_fffffffffffefc30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffefc38;
  xml_node<char> *in_stack_fffffffffffefc40;
  size_t in_stack_fffffffffffefc48;
  size_t in_stack_fffffffffffefc50;
  char *xmlns;
  allocator<char> *name;
  xml_node<char> *in_stack_fffffffffffefc68;
  xml_document<char> *in_stack_fffffffffffefc70;
  streambuf_type *in_stack_fffffffffffefc78;
  xml_document<char> *in_stack_fffffffffffefc80;
  string *in_stack_fffffffffffefc88;
  undefined8 in_stack_fffffffffffefc90;
  string asStack_10368 [32];
  string asStack_10348 [32];
  xml_node<char> *pxStack_10328;
  xml_node<char> *in_stack_ffffffffffff0480;
  allocator<char> local_249 [33];
  vector<char,_std::allocator<char>_> local_228;
  undefined1 local_210 [528];
  
  std::ifstream::ifstream(local_210,in_RDI,8);
  std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
            ((istreambuf_iterator<char,_std::char_traits<char>_> *)in_stack_fffffffffffefc40,
             (istream_type *)in_stack_fffffffffffefc38);
  std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
            ((istreambuf_iterator<char,_std::char_traits<char>_> *)in_stack_fffffffffffefc30);
  name = local_249;
  std::allocator<char>::allocator();
  __first._8_8_ = in_stack_fffffffffffefc90;
  __first._M_sbuf = (streambuf_type *)in_stack_fffffffffffefc88;
  __last._8_8_ = in_stack_fffffffffffefc80;
  __last._M_sbuf = in_stack_fffffffffffefc78;
  std::vector<char,std::allocator<char>>::
  vector<std::istreambuf_iterator<char,std::char_traits<char>>,void>
            ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffefc70,__first,__last,
             (allocator_type *)in_stack_fffffffffffefc68);
  std::allocator<char>::~allocator(local_249);
  std::vector<char,_std::allocator<char>_>::push_back
            ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffefc30,
             in_stack_fffffffffffefc28);
  rapidxml::xml_document<char>::xml_document(in_stack_fffffffffffefc30);
  xmlns = (char *)0x0;
  std::vector<char,_std::allocator<char>_>::operator[](&local_228,0);
  rapidxml::xml_document<char>::parse<0>
            (in_stack_fffffffffffefc80,(char *)in_stack_fffffffffffefc78,in_stack_fffffffffffefc70);
  name_size = rapidxml::xml_node<char>::first_node
                        (in_stack_fffffffffffefc68,(char *)name,xmlns,in_stack_fffffffffffefc50,
                         in_stack_fffffffffffefc48,SUB81((ulong)in_stack_fffffffffffefc40 >> 0x38,0)
                        );
  pxStack_10328 = name_size;
  get_dir(in_stack_fffffffffffefc88);
  std::operator+(in_stack_fffffffffffefc38,(char *)in_stack_fffffffffffefc30);
  std::operator+(in_stack_fffffffffffefc38,(char *)in_stack_fffffffffffefc30);
  std::__cxx11::string::~string(asStack_10368);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffefc78);
  xmlns_size = rapidxml::xml_node<char>::first_node
                         (in_stack_fffffffffffefc68,(char *)name,xmlns,(size_t)name_size,
                          in_stack_fffffffffffefc48,
                          SUB81((ulong)in_stack_fffffffffffefc40 >> 0x38,0));
  pxVar1 = xmlns_size;
  while (pxVar1 != (xml_node<char> *)0x0) {
    read_overlapping_instance(in_stack_ffffffffffff0480);
    in_stack_fffffffffffefc40 =
         rapidxml::xml_node<char>::next_sibling
                   (in_stack_fffffffffffefc68,(char *)name,xmlns,(size_t)name_size,
                    (size_t)xmlns_size,SUB81((ulong)in_stack_fffffffffffefc40 >> 0x38,0));
    pxVar1 = in_stack_fffffffffffefc40;
  }
  for (pxVar1 = rapidxml::xml_node<char>::first_node
                          (in_stack_fffffffffffefc68,(char *)name,xmlns,(size_t)name_size,
                           (size_t)xmlns_size,SUB81((ulong)in_stack_fffffffffffefc40 >> 0x38,0));
      pxVar1 != (xml_node<char> *)0x0;
      pxVar1 = rapidxml::xml_node<char>::next_sibling
                         (pxVar1,(char *)name,xmlns,(size_t)name_size,(size_t)xmlns_size,
                          SUB81((ulong)in_stack_fffffffffffefc40 >> 0x38,0))) {
    read_simpletiled_instance
              ((xml_node<char> *)document.super_memory_pool<char>.m_static_memory._1824_8_,
               (string *)document.super_memory_pool<char>.m_static_memory._1816_8_);
  }
  std::__cxx11::string::~string(asStack_10348);
  rapidxml::xml_document<char>::~xml_document((xml_document<char> *)0x10ef7e);
  std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffefc40);
  std::ifstream::~ifstream(local_210);
  return;
}

Assistant:

void read_config_file(const string &config_path) noexcept {
  ifstream config_file(config_path);
  vector<char> buffer((istreambuf_iterator<char>(config_file)),
                      istreambuf_iterator<char>());
  buffer.push_back('\0');
  xml_document<> document;
  document.parse<0>(&buffer[0]);

  xml_node<> *root_node = document.first_node("samples");
  string dir_path = get_dir(config_path) + "/" + "samples";
  for (xml_node<> *node = root_node->first_node("overlapping"); node;
       node = node->next_sibling("overlapping")) {
    read_overlapping_instance(node);
  }
  for (xml_node<> *node = root_node->first_node("simpletiled"); node;
       node = node->next_sibling("simpletiled")) {
    read_simpletiled_instance(node, dir_path);
  }
}